

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O0

void P_SerializeWorld(FArchive *arc)

{
  ReverbContainer *pRVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  FArchive *pFVar4;
  FDynamicColormap *pFVar5;
  ulong uVar6;
  side_t *si;
  byte local_3d;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_3c;
  anon_union_4_2_12391d7c_for_PalEntry_0 aStack_38;
  BYTE desaturate;
  PalEntry fade;
  PalEntry color;
  BYTE sat;
  zone_t *zn;
  line_t *li;
  sector_t *sec;
  int j;
  int i;
  FArchive *arc_local;
  
  li = (line_t *)sectors;
  for (sec._4_4_ = 0; sec._4_4_ < numsectors; sec._4_4_ = sec._4_4_ + 1) {
    pFVar4 = operator<<(arc,(secplane_t *)&li[1].delta.Y);
    operator<<(pFVar4,(secplane_t *)&li[1].alpha);
    FArchive::operator<<(arc,(SWORD *)((long)&li[1].frontsector + 2));
    FArchive::operator<<(arc,(SWORD *)&li[1].frontsector);
    pFVar4 = FArchive::operator<<(arc,(BYTE *)(li[2].bbox + 1));
    pFVar4 = FArchive::operator<<(pFVar4,(SWORD *)((long)&li[1].frontsector + 4));
    pFVar4 = FArchive::operator<<(pFVar4,&li[2].delta.X);
    pFVar4 = FArchive::operator<<(pFVar4,&li[2].delta.Y);
    pFVar4 = FArchive::operator<<(pFVar4,(SBYTE *)((long)li[2].bbox + 9));
    pFVar4 = FArchive::operator<<(pFVar4,(SWORD *)((long)li[2].bbox + 10));
    pFVar4 = FArchive::operator<<(pFVar4,(SWORD *)((long)li[2].bbox + 0xc));
    pFVar4 = operator<<(pFVar4,(splane *)li);
    pFVar4 = operator<<(pFVar4,(splane *)li->bbox);
    pFVar4 = operator<<(pFVar4,(sector_t **)(li[2].bbox + 3));
    pFVar4 = FArchive::operator<<(pFVar4,(DWORD *)&li[2].frontsector);
    pFVar4 = FArchive::operator<<(pFVar4,(DWORD *)((long)&li[2].frontsector + 4));
    pFVar4 = FArchive::operator<<(pFVar4,(DWORD *)&li[2].backsector);
    FArchive::operator<<(pFVar4,(double *)(li + 3));
    P_SerializeTerrain(arc,(int *)&li[2].flags);
    P_SerializeTerrain(arc,(int *)&li[2].activation);
    FArchive::operator<<(arc,(SDWORD *)((long)&li[3].v2 + 4));
    pFVar4 = FArchive::operator<<(arc,(SWORD *)&li[3].delta);
    pFVar4 = FArchive::operator<<(pFVar4,(SWORD *)((long)&li[3].delta.X + 2));
    pFVar4 = FArchive::operator<<(pFVar4,(FName *)&li[3].v2);
    pFVar4 = FArchive::operator<<(pFVar4,(SDWORD *)&li[1].backsector);
    pFVar4 = FArchive::operator<<(pFVar4,(WORD *)((long)&li[3].delta.X + 6));
    pFVar4 = FArchive::operator<<(pFVar4,(DWORD *)&li[3].delta.Y);
    pFVar4 = FArchive::operator<<(pFVar4,(DWORD *)&li[3].special);
    pFVar4 = FArchive::operator<<(pFVar4,(DWORD *)li[3].args);
    FArchive::operator<<(pFVar4,(WORD *)((long)&li[3].delta.X + 4));
    pFVar4 = operator<<(arc,(TObjPtr<DInterpolation> *)&li[2].alpha);
    pFVar4 = operator<<(pFVar4,(TObjPtr<DInterpolation> *)li[2].sidedef);
    pFVar4 = operator<<(pFVar4,(TObjPtr<DInterpolation> *)(li[2].sidedef + 1));
    pFVar4 = operator<<(pFVar4,(TObjPtr<DInterpolation> *)li[2].bbox);
    FArchive::operator<<(pFVar4,(FName *)((long)&li[1].backsector + 4));
    extsector_t::Serialize(*(extsector_t **)(li[3].args + 3),arc);
    bVar3 = FArchive::IsStoring(arc);
    if (bVar3) {
      pFVar4 = operator<<(arc,(PalEntry *)((long)li[1].bbox[2] + 8));
      operator<<(pFVar4,(PalEntry *)((long)li[1].bbox[2] + 0xc));
      fade.field_0.field_0.a = (BYTE)*(undefined4 *)((long)li[1].bbox[2] + 0x10);
      FArchive::operator<<(arc,&fade.field_0.field_0.a);
    }
    else {
      PalEntry::PalEntry((PalEntry *)&stack0xffffffffffffffc8);
      PalEntry::PalEntry((PalEntry *)&local_3c.field_0);
      pFVar4 = operator<<(arc,(PalEntry *)&stack0xffffffffffffffc8);
      pFVar4 = operator<<(pFVar4,(PalEntry *)&local_3c.field_0);
      FArchive::operator<<(pFVar4,&local_3d);
      pFVar5 = GetSpecialLights((PalEntry)aStack_38.field_0,(PalEntry)local_3c.field_0,
                                (uint)local_3d);
      li[1].bbox[2] = (double)pFVar5;
    }
    pFVar4 = FArchive::operator<<(arc,(float *)((long)&li[3].alpha + 4));
    FArchive::operator<<(pFVar4,(float *)&li[3].alpha);
    li = (line_t *)&li[4].v2;
  }
  zn = (zone_t *)lines;
  for (sec._4_4_ = 0; sec._4_4_ < numlines; sec._4_4_ = sec._4_4_ + 1) {
    pFVar4 = FArchive::operator<<(arc,(DWORD *)(zn + 4));
    pFVar4 = FArchive::operator<<(pFVar4,(DWORD *)((long)&zn[4].Environment + 4));
    pFVar4 = FArchive::operator<<(pFVar4,(SDWORD *)(zn + 5));
    FArchive::operator<<(pFVar4,(double *)(zn + 8));
    bVar3 = P_IsACSSpecial(*(int *)&zn[5].Environment);
    if (bVar3) {
      P_SerializeACSScriptNumber(arc,(int *)((long)&zn[5].Environment + 4),false);
    }
    else {
      FArchive::operator<<(arc,(SDWORD *)((long)&zn[5].Environment + 4));
    }
    pFVar4 = FArchive::operator<<(arc,(SDWORD *)(zn + 6));
    pFVar4 = FArchive::operator<<(pFVar4,(SDWORD *)((long)&zn[6].Environment + 4));
    pFVar4 = FArchive::operator<<(pFVar4,(SDWORD *)(zn + 7));
    FArchive::operator<<(pFVar4,(SDWORD *)((long)&zn[7].Environment + 4));
    FArchive::operator<<(arc,(DWORD *)(zn + 0x12));
    FArchive::operator<<(arc,(DWORD *)((long)&zn[0x12].Environment + 4));
    for (sec._0_4_ = 0; (int)sec < 2; sec._0_4_ = (int)sec + 1) {
      if (zn[(long)(int)sec + 9].Environment != (ReverbContainer *)0x0) {
        pRVar1 = zn[(long)(int)sec + 9].Environment;
        pFVar4 = operator<<(arc,(part *)&pRVar1->ID);
        pFVar4 = operator<<(pFVar4,(part *)&(pRVar1->Properties).ReflectionsDelay);
        pFVar4 = operator<<(pFVar4,(part *)&(pRVar1->Properties).ModulationDepth);
        pFVar4 = FArchive::operator<<(pFVar4,(SWORD *)((long)&pRVar1[1].Properties.Environment + 2))
        ;
        pFVar4 = FArchive::operator<<(pFVar4,(BYTE *)&pRVar1[1].Properties.EnvSize);
        pFVar4 = FArchive::operator<<(pFVar4,(DWORD *)&pRVar1[1].ID);
        pFVar4 = FArchive::operator<<(pFVar4,(DWORD *)&pRVar1[1].Properties);
        FArchive::operator<<(pFVar4,(SDWORD *)&pRVar1[1].Properties.EnvDiffusion);
      }
    }
    zn = zn + 0x13;
  }
  FArchive::operator<<(arc,&numzones);
  bVar3 = FArchive::IsLoading(arc);
  if (bVar3) {
    if ((zones != (zone_t *)0x0) && (zones != (zone_t *)0x0)) {
      operator_delete__(zones);
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)numzones;
    uVar6 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    zones = (zone_t *)operator_new__(uVar6);
  }
  _color = zones;
  for (sec._4_4_ = 0; sec._4_4_ < numzones; sec._4_4_ = sec._4_4_ + 1) {
    operator<<(arc,&_color->Environment);
    _color = _color + 1;
  }
  pFVar4 = operator<<(arc,&linePortals);
  operator<<(pFVar4,&sectorPortals);
  P_CollectLinkedPortals();
  return;
}

Assistant:

void P_SerializeWorld (FArchive &arc)
{
	int i, j;
	sector_t *sec;
	line_t *li;
	zone_t *zn;

	// do sectors
	for (i = 0, sec = sectors; i < numsectors; i++, sec++)
	{
		arc << sec->floorplane
			<< sec->ceilingplane;
		arc << sec->lightlevel;
		arc << sec->special;
		arc << sec->soundtraversed
			<< sec->seqType
			<< sec->friction
			<< sec->movefactor
			<< sec->stairlock
			<< sec->prevsec
			<< sec->nextsec
			<< sec->planes[sector_t::floor]
			<< sec->planes[sector_t::ceiling]
			<< sec->heightsec
			<< sec->bottommap << sec->midmap << sec->topmap
			<< sec->gravity;
		P_SerializeTerrain(arc, sec->terrainnum[0]);
		P_SerializeTerrain(arc, sec->terrainnum[1]);
		arc << sec->damageamount;
		arc << sec->damageinterval
			<< sec->leakydamage
			<< sec->damagetype
			<< sec->sky
			<< sec->MoreFlags
			<< sec->Flags
			<< sec->Portals[sector_t::floor] << sec->Portals[sector_t::ceiling]
			<< sec->ZoneNumber;
		arc	<< sec->interpolations[0]
			<< sec->interpolations[1]
			<< sec->interpolations[2]
			<< sec->interpolations[3]
			<< sec->SeqName;

		sec->e->Serialize(arc);
		if (arc.IsStoring ())
		{
			arc << sec->ColorMap->Color
				<< sec->ColorMap->Fade;
			BYTE sat = sec->ColorMap->Desaturate;
			arc << sat;
		}
		else
		{
			PalEntry color, fade;
			BYTE desaturate;
			arc << color << fade
				<< desaturate;
			sec->ColorMap = GetSpecialLights (color, fade, desaturate);
		}
		// begin of GZDoom additions
		arc << sec->reflect[sector_t::ceiling] << sec->reflect[sector_t::floor];
		// end of GZDoom additions
	}

	// do lines
	for (i = 0, li = lines; i < numlines; i++, li++)
	{
		arc << li->flags
			<< li->activation
			<< li->special
			<< li->alpha;

		if (P_IsACSSpecial(li->special))
		{
			P_SerializeACSScriptNumber(arc, li->args[0], false);
		}
		else
		{
			arc << li->args[0];
		}
		arc << li->args[1] << li->args[2] << li->args[3] << li->args[4];

			arc << li->portalindex;
			arc << li->portaltransferred;	// GZDoom addition.

		for (j = 0; j < 2; j++)
		{
			if (li->sidedef[j] == NULL)
				continue;

			side_t *si = li->sidedef[j];
			arc << si->textures[side_t::top]
				<< si->textures[side_t::mid]
				<< si->textures[side_t::bottom]
				<< si->Light
				<< si->Flags
				<< si->LeftSide
				<< si->RightSide
				<< si->Index;
		}
	}

	// do zones
	arc << numzones;

	if (arc.IsLoading())
	{
		if (zones != NULL)
		{
			delete[] zones;
		}
		zones = new zone_t[numzones];
	}

	for (i = 0, zn = zones; i < numzones; ++i, ++zn)
	{
		arc << zn->Environment;
	}

	arc << linePortals << sectorPortals;
	P_CollectLinkedPortals();
}